

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::SetTitle(App *this,string *title)

{
  int iVar1;
  char *__s1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  
  std::__cxx11::string::_M_assign((string *)&this->appTitle);
  __s1 = getenv("TERM");
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,"screen");
    if (iVar1 == 0) {
      pcVar3 = "\x1b\\";
      pcVar4 = "\x1b_";
    }
    else {
      iVar1 = strncmp(__s1,"xterm",5);
      pcVar3 = "\a";
      pcVar4 = "\x1b]0;";
      if (((iVar1 != 0) && (iVar1 = strncmp(__s1,"rxvt",4), iVar1 != 0)) &&
         (iVar1 = strcmp(__s1,"Eterm"), iVar1 != 0)) goto LAB_00171aeb;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
    poVar2 = std::operator<<(poVar2,(this->appTitle)._M_dataplus._M_p);
    std::operator<<(poVar2,pcVar3);
  }
LAB_00171aeb:
  Window::InvalidateScreen();
  return;
}

Assistant:

void App::SetTitle(const std::string& title) {
    this->appTitle = title;
#ifdef WIN32
    PDC_set_title(this->appTitle.c_str());
    win32::SetAppTitle(this->appTitle);
#else
    /* stolen from https://github.com/cmus/cmus/blob/fead80b207b79ae6d10ab2b1601b11595d719908/ui_curses.c#L2349 */
    const char* term = getenv("TERM");
    if (term) {
        if (!strcmp(term, "screen")) {
            std::cout << "\033_" << this->appTitle.c_str() << "\033\\";
        }
        else if (!strncmp(term, "xterm", 5) ||
                 !strncmp(term, "rxvt", 4) ||
                 !strcmp(term, "Eterm"))
        {
            std::cout << "\033]0;" << this->appTitle.c_str() << "\007";
        }
    }
    Window::InvalidateScreen();
#endif
}